

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

double QuakePower(double factor,double intensity,double offset)

{
  double dVar1;
  double local_28;
  double randumb;
  double offset_local;
  double intensity_local;
  double factor_local;
  
  if ((intensity != 0.0) || (NAN(intensity))) {
    dVar1 = FRandom::GenRand_Real2(&pr_torchflicker);
    local_28 = dVar1 * intensity * 2.0 - intensity;
  }
  else {
    local_28 = 0.0;
  }
  return factor * (offset + local_28);
}

Assistant:

static double QuakePower(double factor, double intensity, double offset)
{ 
	double randumb;
	if (intensity == 0)
	{
		randumb = 0;
	}
	else
	{
		randumb = pr_torchflicker.GenRand_Real2() * (intensity * 2) - intensity;
	}
	return factor * (offset + randumb);
}